

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O3

void WebRtcNs_AnalyzeCore(NoiseSuppressionC *self,float *speechFrame)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t time_data_length;
  int iVar3;
  size_t i;
  ulong uVar4;
  float *pfVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  size_t __n;
  uint uVar18;
  float energy;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar26;
  double dVar24;
  double dVar25;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float magn [129];
  float noise [129];
  float snrLocPost [129];
  float imag [129];
  float snrLocPrior [129];
  float winData [256];
  float real [256];
  float local_12f0;
  float local_12e8;
  undefined8 local_12b8;
  undefined8 local_12a8;
  float local_1288 [132];
  float local_1078 [132];
  float afStack_e68 [132];
  float local_c58 [132];
  float afStack_a48 [132];
  float local_838 [256];
  float local_438 [258];
  
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x429,"void WebRtcNs_AnalyzeCore(NoiseSuppressionC *, const float *)");
  }
  iVar11 = self->modelUpdatePars[0];
  UpdateBuffer(speechFrame,self->blockLen,self->anaLen,self->analyzeBuf);
  time_data_length = self->anaLen;
  if (time_data_length == 0) {
    return;
  }
  pfVar5 = self->window;
  sVar7 = 0;
  do {
    local_838[sVar7] = pfVar5[sVar7] * self->analyzeBuf[sVar7];
    sVar7 = sVar7 + 1;
  } while (time_data_length != sVar7);
  fVar19 = 0.0;
  sVar7 = 0;
  do {
    fVar19 = fVar19 + local_838[sVar7] * local_838[sVar7];
    sVar7 = sVar7 + 1;
  } while (time_data_length != sVar7);
  if ((fVar19 == 0.0) && (!NAN(fVar19))) {
    return;
  }
  self->blockInd = self->blockInd + 1;
  FFT(self,local_838,time_data_length,self->magnLen,local_438,local_c58,local_1288);
  uVar4 = self->magnLen;
  if (uVar4 == 0) {
    local_12a8 = 0;
    uVar4 = 0;
    auVar29._0_4_ = 0.0;
    local_12b8 = 0;
    fVar19 = 0.0;
  }
  else {
    local_12a8 = 0;
    auVar29._0_4_ = 0.0;
    uVar17 = 0;
    fVar19 = 0.0;
    local_12b8 = 0;
    do {
      fVar22 = local_438[uVar17];
      fVar26 = local_c58[uVar17];
      fVar32 = local_1288[uVar17];
      if ((4 < uVar17) && (self->blockInd < 0x32)) {
        fVar20 = logf((float)uVar17);
        fVar21 = logf(fVar32);
        local_12a8 = CONCAT44(local_12a8._4_4_ + fVar20,(float)local_12a8 + fVar21);
        local_12b8 = CONCAT44(local_12b8._4_4_ + fVar20 * fVar20,(float)local_12b8 + fVar20 * fVar21
                             );
        uVar4 = self->magnLen;
      }
      fVar19 = fVar19 + fVar22 * fVar22 + fVar26 * fVar26;
      auVar29._0_4_ = auVar29._0_4_ + fVar32;
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar4);
  }
  self->signalEnergy = fVar19 / (float)uVar4;
  self->sumMagn = auVar29._0_4_;
  if (self->updates < 200) {
    self->updates = self->updates + 1;
  }
  if (uVar4 == 0) {
    uVar17 = 0;
  }
  else {
    uVar10 = 0;
    do {
      dVar23 = log((double)local_1288[uVar10]);
      afStack_e68[uVar10] = (float)dVar23;
      uVar10 = uVar10 + 1;
      uVar17 = self->magnLen;
    } while (uVar10 < uVar17);
  }
  lVar14 = -4;
  lVar15 = 0;
  lVar16 = 0;
  uVar12 = uVar17;
  uVar10 = uVar17;
  do {
    uVar8 = uVar12;
    iVar6 = self->counter[lVar16];
    if (uVar8 != 0) {
      lVar9 = uVar8 * lVar15;
      uVar12 = 0;
      do {
        fVar22 = *(float *)((long)self->density + uVar12 * 4 + lVar9);
        fVar20 = (float)(~-(uint)(1.0 < fVar22) & 0x42200000 |
                        (uint)(40.0 / fVar22) & -(uint)(1.0 < fVar22));
        fVar26 = afStack_e68[uVar12];
        fVar32 = *(float *)((long)self->lquantile + uVar12 * 4 + lVar9 + 0x1248 + -0x1248);
        if (fVar26 <= fVar32) {
          fVar20 = fVar20 * -0.75;
        }
        else {
          fVar20 = fVar20 * 0.25;
        }
        fVar32 = fVar32 + fVar20 / (float)(iVar6 + 1);
        *(float *)((long)self->lquantile + uVar12 * 4 + lVar9 + 0x1248 + -0x1248) = fVar32;
        if (ABS(fVar26 - fVar32) < 0.01) {
          *(float *)((long)self->density + uVar12 * 4 + lVar9) =
               (fVar22 * (float)iVar6 + 50.0) / (float)(iVar6 + 1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
    }
    uVar12 = uVar8;
    if (199 < iVar6) {
      self->counter[lVar16] = 0;
      iVar6 = 0;
      if (199 < self->updates) {
        if (uVar17 == 0) {
          iVar6 = 0;
          uVar17 = 0;
          uVar12 = 0;
        }
        else {
          uVar10 = 0;
          do {
            dVar23 = exp((double)*(float *)((long)self->lquantile + uVar10 * 4 + uVar8 * lVar15));
            self->quantile[uVar10] = (float)dVar23;
            uVar10 = uVar10 + 1;
            uVar17 = self->magnLen;
          } while (uVar10 < uVar17);
          iVar6 = self->counter[lVar16];
          uVar12 = uVar17;
          uVar10 = uVar17;
        }
      }
    }
    self->counter[lVar16] = iVar6 + 1;
    lVar16 = lVar16 + 1;
    lVar14 = lVar14 + 4;
    lVar15 = lVar15 + 4;
  } while (lVar16 != 3);
  if (self->updates < 200) {
    if (uVar10 != 0) {
      uVar17 = 0;
      do {
        dVar23 = exp((double)*(float *)((long)self->lquantile + uVar17 * 4 + uVar8 * lVar14));
        self->quantile[uVar17] = (float)dVar23;
        uVar17 = uVar17 + 1;
        uVar10 = self->magnLen;
      } while (uVar17 < uVar10);
      goto LAB_001830a0;
    }
  }
  else {
LAB_001830a0:
    if (uVar10 != 0) {
      memcpy(local_1078,self->quantile,uVar10 << 2);
    }
  }
  iVar6 = self->blockInd;
  if (iVar6 < 0x32) {
    self->whiteNoiseLevel =
         (auVar29._0_4_ / (float)uVar10) * self->overdrive + self->whiteNoiseLevel;
    fVar26 = -local_12a8._4_4_ * local_12a8._4_4_ + (float)(uVar10 - 5) * local_12b8._4_4_;
    fVar22 = (local_12b8._4_4_ * (float)local_12a8 + -local_12a8._4_4_ * (float)local_12b8) / fVar26
    ;
    fVar26 = (local_12a8._4_4_ * (float)local_12a8 - (float)(uVar10 - 5) * (float)local_12b8) /
             fVar26;
    auVar29._0_4_ = 0.0;
    if (0.0 <= fVar26) {
      auVar29._0_4_ = fVar26;
    }
    uVar1 = self->pinkNoiseNumerator;
    uVar2 = self->pinkNoiseExp;
    fVar22 = (float)uVar1 + (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar22);
    auVar29._0_4_ =
         (float)uVar2 +
         (float)(-(uint)(1.0 < auVar29._0_4_) & 0x3f800000 |
                ~-(uint)(1.0 < auVar29._0_4_) & (uint)auVar29._0_4_);
    self->pinkNoiseNumerator = fVar22;
    self->pinkNoiseExp = auVar29._0_4_;
    local_12e8 = 0.0;
    if (auVar29._0_4_ <= 0.0) {
      local_12f0 = 0.0;
    }
    else {
      local_12f0 = expf(fVar22 / (float)(iVar6 + 1));
      iVar6 = self->blockInd;
      local_12f0 = local_12f0 * (float)(iVar6 + 1);
      local_12e8 = auVar29._0_4_ / (float)(iVar6 + 1);
    }
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      uVar17 = 0;
      do {
        if ((self->pinkNoiseExp != 0.0) || (NAN(self->pinkNoiseExp))) {
          uVar10 = 5;
          if (5 < uVar17) {
            uVar10 = uVar17;
          }
          auVar29._0_4_ = powf((float)uVar10,local_12e8);
          auVar29._0_4_ = local_12f0 / auVar29._0_4_;
          self->parametricNoise[uVar17] = auVar29._0_4_;
          iVar6 = self->blockInd;
          uVar10 = self->magnLen;
        }
        else {
          auVar29._0_4_ = self->whiteNoiseLevel;
          self->parametricNoise[uVar17] = auVar29._0_4_;
        }
        local_1078[uVar17] =
             (((float)(0x32 - iVar6) * auVar29._0_4_) / (float)(iVar6 + 1) +
             (float)iVar6 * local_1078[uVar17]) / 50.0;
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar10);
    }
  }
  auVar29._0_4_ = 1.0;
  if (iVar6 < 200) {
    self->featureData[5] =
         (fVar19 / (float)uVar4 + (float)iVar6 * self->featureData[5]) / (float)(iVar6 + 1);
  }
  if (uVar10 == 0) {
    fVar22 = self->sumMagn - local_1288[0];
    fVar19 = 0.0;
    auVar29._0_4_ = 0.0;
LAB_00183501:
    dVar23 = exp((double)(fVar19 / auVar29._0_4_));
    self->featureData[0] =
         ((float)dVar23 / (fVar22 / auVar29._0_4_) - self->featureData[0]) * 0.3 +
         self->featureData[0];
    uVar10 = self->magnLen;
    if (uVar10 != 0) goto LAB_00183556;
    auVar29._0_4_ = 0.0;
    fVar22 = 0.0;
    fVar19 = 0.0;
    fVar26 = 0.0;
  }
  else {
    uVar4 = 0;
    do {
      fVar19 = self->magnPrevAnalyze[uVar4];
      fVar22 = self->noisePrev[uVar4];
      fVar26 = self->smooth[uVar4];
      afStack_e68[uVar4] = 0.0;
      fVar32 = 0.0;
      if (local_1078[uVar4] < local_1288[uVar4]) {
        fVar32 = local_1288[uVar4] / (local_1078[uVar4] + 0.0001) + -1.0;
        afStack_e68[uVar4] = fVar32;
        fVar32 = fVar32 * 0.01999998;
      }
      afStack_a48[uVar4] = (fVar19 / (fVar22 + 0.0001)) * fVar26 * 0.98 + fVar32;
      uVar4 = uVar4 + 1;
    } while (uVar10 != uVar4);
    fVar22 = self->sumMagn - local_1288[0];
    fVar19 = 0.0;
    if (uVar10 == 1) goto LAB_00183501;
    if (0.0 < local_1288[1]) {
      uVar4 = 2;
      do {
        dVar23 = log((double)local_1288[1]);
        fVar19 = (float)dVar23 + fVar19;
        uVar10 = self->magnLen;
        if (uVar10 <= uVar4) {
          auVar29._0_4_ = (float)uVar10;
          goto LAB_00183501;
        }
        local_1288[1] = local_1288[uVar4];
        uVar4 = uVar4 + 1;
      } while (0.0 < local_1288[1]);
    }
    self->featureData[0] = self->featureData[0] * -0.3 + self->featureData[0];
LAB_00183556:
    auVar29._0_4_ = 0.0;
    uVar4 = 0;
    do {
      auVar29._0_4_ = auVar29._0_4_ + self->magnAvgPause[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar10 != uVar4);
    fVar19 = (float)uVar10;
    auVar29._4_4_ = self->sumMagn;
    auVar29._8_8_ = 0;
    auVar30._4_4_ = fVar19;
    auVar30._0_4_ = fVar19;
    auVar30._8_4_ = fVar19;
    auVar30._12_4_ = fVar19;
    auVar30 = divps(auVar29,auVar30);
    auVar29._0_4_ = 0.0;
    fVar22 = 0.0;
    fVar26 = 0.0;
    uVar4 = 0;
    do {
      fVar32 = self->magnAvgPause[uVar4] - auVar30._0_4_;
      fVar20 = local_1288[uVar4] - auVar30._4_4_;
      fVar26 = fVar26 + fVar20 * fVar32;
      auVar29._0_4_ = auVar29._0_4_ + fVar32 * fVar32;
      fVar22 = fVar22 + fVar20 * fVar20;
      uVar4 = uVar4 + 1;
    } while (uVar10 != uVar4);
  }
  self->featureData[6] = self->signalEnergy + self->featureData[6];
  self->featureData[4] =
       ((fVar22 / fVar19 -
        ((fVar26 / fVar19) * (fVar26 / fVar19)) / (auVar29._0_4_ / fVar19 + 0.0001)) /
        (self->featureData[5] + 0.0001) - self->featureData[4]) * 0.3 + self->featureData[4];
  if (0 < iVar11) {
    iVar6 = self->modelUpdatePars[3];
    iVar3 = iVar6 + -1;
    self->modelUpdatePars[3] = iVar3;
    if (1 < iVar6) {
      FeatureParameterExtraction(self,0);
      iVar3 = self->modelUpdatePars[3];
    }
    if (iVar3 == 0) {
      FeatureParameterExtraction(self,1);
      self->modelUpdatePars[3] = self->modelUpdatePars[1];
      if (iVar11 == 1) {
        self->modelUpdatePars[0] = 0;
      }
      else {
        self->featureData[5] =
             (self->featureData[6] / (float)self->modelUpdatePars[1] + self->featureData[5]) * 0.5;
        self->featureData[6] = 0.0;
      }
    }
  }
  fVar19 = self->priorModelPars[0];
  auVar29._0_4_ = self->priorModelPars[1];
  fVar22 = self->priorModelPars[3];
  iVar11 = (int)self->priorModelPars[2];
  fVar26 = self->priorModelPars[4];
  fVar32 = self->priorModelPars[5];
  fVar20 = self->priorModelPars[6];
  if (self->magnLen == 0) {
    fVar21 = NAN;
  }
  else {
    fVar21 = 0.0;
    uVar4 = 0;
    do {
      fVar27 = afStack_a48[uVar4] + afStack_a48[uVar4];
      fVar31 = fVar27 + 1.0;
      fVar28 = afStack_e68[uVar4];
      dVar23 = log((double)fVar31);
      fVar28 = (((fVar28 + 1.0) * (fVar27 / (fVar31 + 0.0001)) - (float)dVar23) -
               self->logLrtTimeAvg[uVar4]) * 0.5 + self->logLrtTimeAvg[uVar4];
      self->logLrtTimeAvg[uVar4] = fVar28;
      fVar21 = fVar21 + fVar28;
      uVar4 = uVar4 + 1;
    } while (uVar4 < self->magnLen);
    fVar21 = fVar21 / (float)self->magnLen;
  }
  self->featureData[3] = fVar21;
  uVar18 = -(uint)(fVar21 < fVar19);
  dVar23 = tanh((double)((fVar21 - fVar19) * (float)(~uVar18 & 0x40800000 | uVar18 & 0x41000000)));
  fVar19 = self->featureData[0];
  if (iVar11 == 1) {
    fVar21 = (float)(~-(uint)(auVar29._0_4_ < fVar19) & 0x40800000 |
                    -(uint)(auVar29._0_4_ < fVar19) & 0x41000000);
  }
  else {
    fVar21 = 4.0;
  }
  if (iVar11 == -1) {
    fVar21 = (float)(-(uint)(fVar19 < auVar29._0_4_) & 0x41000000 |
                    ~-(uint)(fVar19 < auVar29._0_4_) & (uint)fVar21);
  }
  dVar24 = tanh((double)((auVar29._0_4_ - fVar19) * (float)iVar11 * fVar21));
  uVar18 = -(uint)(self->featureData[4] < fVar22);
  dVar25 = tanh((double)((self->featureData[4] - fVar22) *
                        (float)(~uVar18 & 0x40800000 | uVar18 & 0x41000000)));
  auVar29._0_4_ =
       ((fVar26 * ((float)dVar23 + 1.0) * 0.5 + fVar32 * ((float)dVar24 + 1.0) * 0.5 +
        fVar20 * ((float)dVar25 + 1.0) * 0.5) - self->priorSpeechProb) * 0.1 + self->priorSpeechProb
  ;
  fVar19 = 1.0;
  if (auVar29._0_4_ <= 1.0) {
    fVar19 = auVar29._0_4_;
  }
  auVar29._0_4_ = 0.01;
  if (0.01 <= fVar19) {
    auVar29._0_4_ = fVar19;
  }
  self->priorSpeechProb = auVar29._0_4_;
  if (self->magnLen != 0) {
    uVar4 = 0;
    do {
      dVar23 = exp((double)-self->logLrtTimeAvg[uVar4]);
      self->speechProb[uVar4] =
           1.0 / ((float)dVar23 * ((1.0 - auVar29._0_4_) / (auVar29._0_4_ + 0.0001)) + 1.0);
      uVar4 = uVar4 + 1;
      uVar17 = self->magnLen;
    } while (uVar4 < uVar17);
    if (uVar17 != 0) {
      pfVar5 = local_1078;
      uVar4 = 0;
      fVar19 = 0.9;
      do {
        auVar29._0_4_ = self->speechProb[uVar4];
        fVar22 = local_1288[uVar4];
        if (auVar29._0_4_ < 0.2) {
          self->magnAvgPause[uVar4] =
               (fVar22 - self->magnAvgPause[uVar4]) * 0.05 + self->magnAvgPause[uVar4];
        }
        fVar26 = self->noisePrev[uVar4];
        fVar32 = (1.0 - auVar29._0_4_) * fVar22 + auVar29._0_4_ * fVar26;
        fVar22 = fVar19 * fVar26 + (1.0 - fVar19) * fVar32;
        auVar29._0_4_ = *(float *)(&DAT_001acea0 + (ulong)(0.2 < auVar29._0_4_) * 4);
        if ((auVar29._0_4_ != fVar19) || (pfVar13 = pfVar5, NAN(auVar29._0_4_) || NAN(fVar19))) {
          fVar19 = fVar26 * auVar29._0_4_ + (1.0 - auVar29._0_4_) * fVar32;
          *pfVar5 = fVar19;
          if (fVar22 < fVar19) {
            pfVar13 = local_1078 + uVar4;
            goto LAB_00183ba1;
          }
        }
        else {
LAB_00183ba1:
          *pfVar13 = fVar22;
        }
        uVar4 = uVar4 + 1;
        pfVar5 = pfVar5 + 1;
        fVar19 = auVar29._0_4_;
      } while (uVar17 != uVar4);
      __n = uVar17 << 2;
      goto LAB_00183bc1;
    }
  }
  __n = 0;
LAB_00183bc1:
  memcpy(self->noise,local_1078,__n);
  memcpy(self->magnPrevAnalyze,local_1288,__n);
  return;
}

Assistant:

void WebRtcNs_AnalyzeCore(NoiseSuppressionC* self, const float* speechFrame) {
  size_t i;
  const size_t kStartBand = 5;  // Skip first frequency bins during estimation.
  int updateParsFlag;
  float energy;
  float signalEnergy = 0.f;
  float sumMagn = 0.f;
  float tmpFloat1, tmpFloat2, tmpFloat3;
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL], noise[HALF_ANAL_BLOCKL];
  float snrLocPost[HALF_ANAL_BLOCKL], snrLocPrior[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];
  // Variables during startup.
  float sum_log_i = 0.0;
  float sum_log_i_square = 0.0;
  float sum_log_magn = 0.0;
  float sum_log_i_log_magn = 0.0;
  float parametric_exp = 0.0;
  float parametric_num = 0.0;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  updateParsFlag = self->modelUpdatePars[0];

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame, self->blockLen, self->anaLen, self->analyzeBuf);

  Windowing(self->window, self->analyzeBuf, self->anaLen, winData);
  energy = Energy(winData, self->anaLen);
  if (energy == 0.0) {
    // We want to avoid updating statistics in this case:
    // Updating feature statistics when we have zeros only will cause
    // thresholds to move towards zero signal situations. This in turn has the
    // effect that once the signal is "turned on" (non-zero values) everything
    // will be treated as speech and there is no noise suppression effect.
    // Depending on the duration of the inactive signal it takes a
    // considerable amount of time for the system to learn what is noise and
    // what is speech.
    return;
  }

  self->blockInd++;  // Update the block index only when we process a block.

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  for (i = 0; i < self->magnLen; i++) {
    signalEnergy += real[i] * real[i] + imag[i] * imag[i];
    sumMagn += magn[i];
    if (self->blockInd < END_STARTUP_SHORT) {
      if (i >= kStartBand) {
        tmpFloat2 = logf((float)i);
        sum_log_i += tmpFloat2;
        sum_log_i_square += tmpFloat2 * tmpFloat2;
        tmpFloat1 = logf(magn[i]);
        sum_log_magn += tmpFloat1;
        sum_log_i_log_magn += tmpFloat2 * tmpFloat1;
      }
    }
  }
  signalEnergy /= self->magnLen;
  self->signalEnergy = signalEnergy;
  self->sumMagn = sumMagn;

  // Quantile noise estimate.
  NoiseEstimation(self, magn, noise);
  // Compute simplified noise model during startup.
  if (self->blockInd < END_STARTUP_SHORT) {
    // Estimate White noise.
    self->whiteNoiseLevel += sumMagn / self->magnLen * self->overdrive;
    // Estimate Pink noise parameters.
    tmpFloat1 = sum_log_i_square * (self->magnLen - kStartBand);
    tmpFloat1 -= (sum_log_i * sum_log_i);
    tmpFloat2 =
        (sum_log_i_square * sum_log_magn - sum_log_i * sum_log_i_log_magn);
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the estimated spectrum to be positive.
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    self->pinkNoiseNumerator += tmpFloat3;
    tmpFloat2 = (sum_log_i * sum_log_magn);
    tmpFloat2 -= (self->magnLen - kStartBand) * sum_log_i_log_magn;
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the pink noise power to be in the interval [0, 1].
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    if (tmpFloat3 > 1.f) {
      tmpFloat3 = 1.f;
    }
    self->pinkNoiseExp += tmpFloat3;

    // Calculate frequency independent parts of parametric noise estimate.
    if (self->pinkNoiseExp > 0.f) {
      // Use pink noise estimate.
      parametric_num =
          expf(self->pinkNoiseNumerator / (float)(self->blockInd + 1));
      parametric_num *= (float)(self->blockInd + 1);
      parametric_exp = self->pinkNoiseExp / (float)(self->blockInd + 1);
    }
    for (i = 0; i < self->magnLen; i++) {
      // Estimate the background noise using the white and pink noise
      // parameters.
      if (self->pinkNoiseExp == 0.f) {
        // Use white noise estimate.
        self->parametricNoise[i] = self->whiteNoiseLevel;
      } else {
        // Use pink noise estimate.
        float use_band = (float)(i < kStartBand ? kStartBand : i);
        self->parametricNoise[i] =
            parametric_num / powf(use_band, parametric_exp);
      }
      // Weight quantile noise with modeled noise.
      noise[i] *= (self->blockInd);
      tmpFloat2 =
          self->parametricNoise[i] * (END_STARTUP_SHORT - self->blockInd);
      noise[i] += (tmpFloat2 / (float)(self->blockInd + 1));
      noise[i] /= END_STARTUP_SHORT;
    }
  }
  // Compute average signal during END_STARTUP_LONG time:
  // used to normalize spectral difference measure.
  if (self->blockInd < END_STARTUP_LONG) {
    self->featureData[5] *= self->blockInd;
    self->featureData[5] += signalEnergy;
    self->featureData[5] /= (self->blockInd + 1);
  }

  // Post and prior SNR needed for SpeechNoiseProb.
  ComputeSnr(self, magn, noise, snrLocPrior, snrLocPost);

  FeatureUpdate(self, magn, updateParsFlag);
  SpeechNoiseProb(self, self->speechProb, snrLocPrior, snrLocPost);
  UpdateNoiseEstimate(self, magn, snrLocPrior, snrLocPost, noise);

  // Keep track of noise spectrum for next frame.
  memcpy(self->noise, noise, sizeof(*noise) * self->magnLen);
  memcpy(self->magnPrevAnalyze, magn, sizeof(*magn) * self->magnLen);
}